

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_util.cpp
# Opt level: O0

void __thiscall
ANNRectangle::ANNRectangle
          (ANNRectangle *this,ANNcoord lb1,ANNcoord hb1,ANNcoord lb2,ANNcoord hb2,ANNcoord lb3,
          ANNcoord hb3,ANNcoord lb4,ANNcoord hb4)

{
  ANNcoord hb4_local;
  ANNcoord lb4_local;
  ANNcoord hb3_local;
  ANNcoord lb3_local;
  ANNcoord hb2_local;
  ANNcoord lb2_local;
  ANNcoord hb1_local;
  ANNcoord lb1_local;
  ANNRectangle *this_local;
  
  this->bnds1[0] = lb1;
  this->bnds1[1] = hb1;
  this->bnds2[0] = lb2;
  this->bnds2[1] = hb2;
  this->bnds3[0] = lb3;
  this->bnds3[1] = hb3;
  this->bnds4[0] = lb4;
  this->bnds4[1] = hb4;
  return;
}

Assistant:

ANNRectangle::ANNRectangle(  // constructor
    ANNcoord lb1, ANNcoord hb1, ANNcoord lb2, ANNcoord hb2, ANNcoord lb3,
    ANNcoord hb3, ANNcoord lb4, ANNcoord hb4) {
    bnds1[LO] = lb1;
    bnds1[HI] = hb1;
    bnds2[LO] = lb2;
    bnds2[HI] = hb2;
    bnds3[LO] = lb3;
    bnds3[HI] = hb3;
    bnds4[LO] = lb4;
    bnds4[HI] = hb4;
}